

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmGhsMultiTargetGenerator::WriteObjectLangOverride_abi_cxx11_
          (string *__return_storage_ptr__,cmGhsMultiTargetGenerator *this,cmSourceFile *sourceFile)

{
  cmValue cVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_70;
  undefined8 local_50;
  char *local_48;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"LANGUAGE","");
  cVar1 = cmSourceFile::GetProperty((cmSourceFile *)this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (cVar1.Value != (string *)0x0) {
    local_70.field_2._8_8_ = ((cVar1.Value)->_M_dataplus)._M_p;
    local_70.field_2._M_allocated_capacity = (cVar1.Value)->_M_string_length;
    local_70._M_dataplus._M_p = &DAT_00000002;
    local_70._M_string_length = 0x6e9d22;
    local_50 = 1;
    local_48 = "]";
    views._M_len = 3;
    views._M_array = (iterator)&local_70;
    cmCatViews_abi_cxx11_(&local_40,views);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGhsMultiTargetGenerator::WriteObjectLangOverride(
  const cmSourceFile* sourceFile)
{
  std::string ret;
  cmValue rawLangProp = sourceFile->GetProperty("LANGUAGE");
  if (rawLangProp) {
    ret = cmStrCat(" [", *rawLangProp, "]");
  }

  return ret;
}